

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementTetraCorot_4_P::ChElementTetraCorot_4_P
          (ChElementTetraCorot_4_P *this,void **vtt)

{
  ChLoadableUVW CVar1;
  _func_int **pp_Var2;
  ActualDstType actualDst;
  ActualDstType actualDst_1;
  undefined1 auVar3 [64];
  assign_op<double,_double> local_51;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_50;
  
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase =
       (_func_int **)&PTR__ChElementGeneric_00b5b728;
  (this->super_ChElementGeneric).Kmatr.super_ChKblock._vptr_ChKblock =
       (_func_int **)&PTR__ChKblockGeneric_00b62688;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data = (double *)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows = 0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.K.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols = 0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_ChElementGeneric).Kmatr.variables.
  super__Vector_base<chrono::ChVariables_*,_std::allocator<chrono::ChVariables_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational =
       (_func_int **)&PTR__ChElementCorotational_00b59778;
  (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 1.0;
  *(undefined1 (*) [16])
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 8) =
       ZEXT416(0) << 0x40;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x18
   ) = 0.0;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x20
   ) = 1.0;
  *(undefined1 (*) [16])
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x28
   ) = ZEXT416(0) << 0x40;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x38
   ) = 0.0;
  *(double *)
   ((long)(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 0x40
   ) = 1.0;
  CVar1 = *(ChLoadableUVW *)(vtt + 1);
  this->super_ChLoadableUVW = CVar1;
  *(void **)((long)((long)(&this->super_ChElementCorotational + 1) + 8) +
            *(long *)((long)CVar1 + -0x78) + -8) = vtt[2];
  pp_Var2 = (_func_int **)*vtt;
  (this->super_ChElementGeneric).super_ChElementBase._vptr_ChElementBase = pp_Var2;
  (this->super_ChElementCorotational)._vptr_ChElementCorotational = (_func_int **)0xb5c0b0;
  this->super_ChLoadableUVW = *(ChLoadableUVW *)(vtt + 3);
  *(void **)(pp_Var2[-3] + -0x48 +
            (long)&(this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>) =
       vtt[4];
  this->Volume = 0.0;
  auVar3 = ZEXT464(0) << 0x40;
  this->nodes = (vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
                 )auVar3._0_24_;
  this->Material = (shared_ptr<chrono::fea::ChContinuumPoisson3D>)auVar3._24_16_;
  this->MatrB = (ChMatrixDynamic<>)auVar3._40_24_;
  this->Material = (shared_ptr<chrono::fea::ChContinuumPoisson3D>)auVar3._0_16_;
  this->MatrB = (ChMatrixDynamic<>)auVar3._16_24_;
  this->StiffnessMatrix = (ChMatrixDynamic<>)auVar3._40_24_;
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyzP>_>_>
  ::resize(&this->nodes,4);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->MatrB,0xc,3,4);
  local_50.m_rows.m_value =
       (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_rows;
  local_50.m_cols.m_value =
       (this->MatrB).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
       m_cols;
  local_50.m_functor.m_other = 0.0;
  if (-1 < (local_50.m_cols.m_value | local_50.m_rows.m_value)) {
    Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
              (&this->MatrB,&local_50,&local_51);
    Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
              ((DenseStorage<double,__1,__1,__1,_1> *)&this->StiffnessMatrix,0x10,4,4);
    local_50.m_rows.m_value =
         (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
         m_storage.m_rows;
    local_50.m_cols.m_value =
         (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
         m_storage.m_cols;
    local_50.m_functor.m_other = 0.0;
    if (-1 < (local_50.m_cols.m_value | local_50.m_rows.m_value)) {
      Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                (&this->StiffnessMatrix,&local_50,&local_51);
      return;
    }
  }
  local_50.m_functor.m_other = 0.0;
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1, 1>]"
               );
}

Assistant:

ChElementTetraCorot_4_P::ChElementTetraCorot_4_P() : Volume(0) {
    nodes.resize(4);
    this->MatrB.setZero(3, 4);
    this->StiffnessMatrix.setZero(4, 4);
}